

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzintrulet3d.cpp
# Opt level: O3

void __thiscall TPZIntRuleT3D::Loc(TPZIntRuleT3D *this,int i,TPZVec<double> *Points)

{
  double *pdVar1;
  
  if ((-1 < i) && (i < this->fNumInt)) {
    pdVar1 = Points->fStore;
    *pdVar1 = (double)(this->fLocationKsi).super_TPZVec<long_double>.fStore[(uint)i];
    pdVar1[1] = (double)(this->fLocationEta).super_TPZVec<long_double>.fStore[(uint)i];
    pdVar1[2] = (double)(this->fLocationZeta).super_TPZVec<long_double>.fStore[(uint)i];
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"ERROR(TPZIntRuleT::loc) Out of bounds!!\n",0x28);
  return;
}

Assistant:

void TPZIntRuleT3D::Loc(int i, TPZVec<REAL> &Points) const {
	if(i>=0 && i<fNumInt){
		Points[0] = fLocationKsi[i];
		Points[1] = fLocationEta[i];
		Points[2] = fLocationZeta[i];
		return;
	}
	else {
		PZError << "ERROR(TPZIntRuleT::loc) Out of bounds!!\n";
	}
}